

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint32 __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  LogMessage *pLVar6;
  int iVar7;
  uint32 uVar9;
  long lVar10;
  byte *pbVar11;
  bool bVar12;
  LogMessage local_e0;
  LogMessage local_a8;
  LogMessage local_70;
  LogFinisher local_31;
  int iVar8;
  
  iVar4 = (int)this->buffer_;
  iVar8 = (int)this->buffer_end_;
  iVar7 = iVar8 - iVar4;
  if ((iVar7 < 10) && ((iVar7 < 1 || ((char)this->buffer_end_[-1] < '\0')))) {
    if ((iVar8 != iVar4) ||
       (((this->buffer_size_after_limit_ < 1 && (this->total_bytes_read_ != this->current_limit_))
        || (this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_))))
    {
      uVar9 = ReadTagSlow(this);
      return uVar9;
    }
    this->legitimate_message_end_ = true;
  }
  else {
    if (*this->buffer_ != first_byte_or_zero) {
      internal::LogMessage::LogMessage
                (&local_e0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.cc"
                 ,0x219);
      pLVar6 = internal::LogMessage::operator<<
                         (&local_e0,"CHECK failed: (first_byte_or_zero) == (buffer_[0]): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar6);
      internal::LogMessage::~LogMessage(&local_e0);
    }
    pbVar11 = this->buffer_;
    if (first_byte_or_zero != 0) {
      if (*pbVar11 != first_byte_or_zero) {
        internal::LogMessage::LogMessage
                  (&local_a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.cc"
                   ,0x175);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_a8,"CHECK failed: (*buffer) == (first_byte): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar6);
        internal::LogMessage::~LogMessage(&local_a8);
      }
      if (-1 < (char)first_byte_or_zero) {
        internal::LogMessage::LogMessage
                  (&local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.cc"
                   ,0x176);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_70,"CHECK failed: (first_byte & 0x80) == (0x80): ");
        pLVar6 = internal::LogMessage::operator<<(pLVar6,first_byte_or_zero);
        internal::LogFinisher::operator=(&local_31,pLVar6);
        internal::LogMessage::~LogMessage(&local_70);
      }
      uVar9 = ((uint)pbVar11[1] * 0x80 + first_byte_or_zero) - 0x80;
      bVar12 = true;
      if ((char)pbVar11[1] < '\0') {
        uVar9 = (uVar9 + (uint)pbVar11[2] * 0x4000) - 0x4000;
        if ((char)pbVar11[2] < '\0') {
          uVar9 = (uVar9 + (uint)pbVar11[3] * 0x200000) - 0x200000;
          if ((char)pbVar11[3] < '\0') {
            uVar9 = uVar9 + (uint)pbVar11[4] * 0x10000000 + 0xf0000000;
            if ((char)pbVar11[4] < '\0') {
              pbVar3 = pbVar11 + 6;
              if ((char)pbVar11[5] < '\0') {
                pbVar11 = pbVar11 + 10;
                lVar10 = 0;
                do {
                  uVar5 = (uint)lVar10;
                  if (uVar5 == 4) goto LAB_00166629;
                  lVar1 = lVar10 + 1;
                  pbVar2 = pbVar3 + lVar10;
                  lVar10 = lVar1;
                } while ((char)*pbVar2 < '\0');
                pbVar11 = pbVar3 + lVar1;
LAB_00166629:
                bVar12 = 3 < uVar5;
              }
              else {
                bVar12 = false;
                pbVar11 = pbVar3;
              }
              bVar12 = (bool)(bVar12 ^ 1);
            }
            else {
              pbVar11 = pbVar11 + 5;
            }
          }
          else {
            pbVar11 = pbVar11 + 4;
          }
        }
        else {
          pbVar11 = pbVar11 + 3;
        }
      }
      else {
        pbVar11 = pbVar11 + 2;
      }
      if (!bVar12) {
        return 0;
      }
      this->buffer_ = pbVar11;
      return uVar9;
    }
    this->buffer_ = pbVar11 + 1;
  }
  return 0;
}

Assistant:

uint32 CodedInputStream::ReadTagFallback(uint32 first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32 tag;
    ::std::pair<bool, const uint8*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}